

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenGlobalSet(BinaryenModuleRef module,char *name,BinaryenExpressionRef value)

{
  IString *this;
  GlobalSet *this_00;
  undefined1 in_CL;
  string_view sVar1;
  
  this = (IString *)strlen(name);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)name;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
  this_00 = (GlobalSet *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str = sVar1;
  this_00->value = value;
  wasm::GlobalSet::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalSet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalSet(name, (Expression*)value));
}